

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O1

void qt_message_print(QtMsgType msgType,QMessageLogContext *context,QString *message)

{
  undefined1 *puVar1;
  bool bVar2;
  int iVar3;
  QLoggingCategory *this;
  code *pcVar4;
  char *context_00;
  undefined1 auVar5 [16];
  
  context_00 = (char *)context;
  if (msgType != QtFatalMsg) {
    if (context->category != (char *)0x0) {
      context_00 = "default";
      iVar3 = strcmp(context->category,"default");
      if (iVar3 != 0) goto LAB_00213f5e;
    }
    this = QLoggingCategory::defaultCategory();
    if ((this != (QLoggingCategory *)0x0) &&
       (context_00 = (char *)(ulong)msgType, bVar2 = QLoggingCategory::isEnabled(this,msgType),
       !bVar2)) {
      return;
    }
  }
LAB_00213f5e:
  auVar5 = __tls_get_addr(&PTR_006ba338);
  if (*(char *)(auVar5._0_8_ + 0x28) == '\0') {
    puVar1 = (undefined1 *)(auVar5._0_8_ + 0x28);
    *puVar1 = 1;
    pcVar4 = qDefaultMessageHandler;
    if (messageHandler._q_value._M_b._M_p != (__base_type)0x0) {
      pcVar4 = (code *)messageHandler;
    }
    (*pcVar4)((QMessageLogContext *)(ulong)msgType,context,message);
    *puVar1 = 0;
    return;
  }
  stderr_message_handler((QtMsgType)message,(QMessageLogContext *)context_00,auVar5._8_8_);
  return;
}

Assistant:

static void qt_message_print(QtMsgType msgType, const QMessageLogContext &context, const QString &message)
{
    Q_TRACE(qt_message_print, msgType, context.category, context.function, context.file, context.line, message);

    // qDebug, qWarning, ... macros do not check whether category is enabledgc
    if (msgType != QtFatalMsg && isDefaultCategory(context.category)) {
        if (QLoggingCategory *defaultCategory = QLoggingCategory::defaultCategory()) {
            if (!defaultCategory->isEnabled(msgType))
                return;
        }
    }

    // prevent recursion in case the message handler generates messages
    // itself, e.g. by using Qt API
    if (grabMessageHandler()) {
        const auto ungrab = qScopeGuard([]{ ungrabMessageHandler(); });
        auto msgHandler = messageHandler.loadAcquire();
        (msgHandler ? msgHandler : qDefaultMessageHandler)(msgType, context, message);
    } else {
        stderr_message_handler(msgType, context, message);
    }
}